

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guard_builder.cpp
# Opt level: O1

void __thiscall
r_exec::SGuardBuilder::_build
          (SGuardBuilder *this,Code *mdl,uint16_t q0,uint16_t t0,uint16_t t1,uint16_t *write_index)

{
  SGuardBuilder *pSVar1;
  undefined2 uVar2;
  ushort uVar3;
  uint16_t uVar4;
  int iVar5;
  undefined4 extraout_var;
  long *plVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  uint16_t uVar7;
  undefined6 in_register_0000000a;
  uint uVar8;
  undefined6 in_register_00000012;
  TimingGuardBuilder *pTVar9;
  undefined6 in_register_00000082;
  undefined1 local_64 [6];
  uint16_t extent_index;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint16_t local_4c;
  uint16_t local_4a;
  undefined4 local_48;
  undefined4 local_44;
  SGuardBuilder *local_40;
  uint local_34;
  
  local_50 = (uint)CONCAT62(in_register_00000082,t1);
  local_54 = (uint)CONCAT62(in_register_0000000a,t0);
  local_5c = (uint)CONCAT62(in_register_00000012,q0);
  local_40 = this;
  iVar5 = (*(mdl->super__Object)._vptr__Object[9])(mdl,1);
  plVar6 = (long *)CONCAT44(extraout_var,iVar5);
  (**(code **)(*plVar6 + 0x20))(plVar6,2);
  uVar2 = r_code::Atom::asIndex();
  local_58 = CONCAT22(local_58._2_2_,uVar2);
  (**(code **)(*plVar6 + 0x20))(plVar6,3);
  uVar3 = r_code::Atom::asIndex();
  plVar6 = (long *)(**(code **)(*plVar6 + 0x48))(plVar6,0);
  (**(code **)(*plVar6 + 0x20))(plVar6,3);
  local_44 = r_code::Atom::asIndex();
  iVar5 = (*(mdl->super__Object)._vptr__Object[9])(mdl,0);
  plVar6 = (long *)CONCAT44(extraout_var_00,iVar5);
  (**(code **)(*plVar6 + 0x20))(plVar6,2);
  local_4a = r_code::Atom::asIndex();
  (**(code **)(*plVar6 + 0x20))(plVar6,3);
  uVar4 = r_code::Atom::asIndex();
  plVar6 = (long *)(**(code **)(*plVar6 + 0x48))(plVar6,0);
  (**(code **)(*plVar6 + 0x20))(plVar6,3);
  local_48 = r_code::Atom::asIndex();
  *write_index = *write_index + 1;
  r_code::Atom::IPointer((ushort)local_64);
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar5),(Atom *)local_64);
  local_4c = uVar4;
  r_code::Atom::~Atom((Atom *)local_64);
  r_code::Atom::Set((uchar)local_64);
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)*write_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar5),(Atom *)local_64);
  pTVar9 = (TimingGuardBuilder *)local_64;
  r_code::Atom::~Atom((Atom *)pTVar9);
  pSVar1 = local_40;
  extent_index = *write_index + 3;
  uVar4 = (uint16_t)local_58;
  uVar7 = (uint16_t)local_54;
  uVar8 = local_58 & 0xffff;
  local_58 = local_54 & 0xffff;
  local_54 = uVar8;
  TimingGuardBuilder::write_guard
            (pTVar9,mdl,uVar4,uVar7,Opcodes::Add,(local_40->super_TimingGuardBuilder).period,
             write_index,&extent_index);
  uVar4 = (uint16_t)local_50;
  local_34 = local_50 & 0xffff;
  local_50 = (uint)uVar3;
  TimingGuardBuilder::write_guard
            (pTVar9,mdl,uVar3,uVar4,Opcodes::Add,(pSVar1->super_TimingGuardBuilder).period,
             write_index,&extent_index);
  uVar7 = extent_index;
  uVar3 = extent_index + 1;
  extent_index = uVar3;
  r_code::Atom::AssignmentPointer((uchar)local_64,(ushort)(byte)local_44);
  uVar4 = *write_index;
  *write_index = uVar4 + 1;
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(uVar4 + 1));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  r_code::Atom::Operator((ushort)local_64,(uchar)Opcodes::Add);
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)uVar3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  uVar8 = local_5c & 0xffff;
  r_code::Atom::VLPointer((ushort)local_64,(ushort)local_5c);
  extent_index = uVar7 + 2;
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)extent_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  extent_index = uVar7 + 3;
  r_code::Atom::IPointer((ushort)local_64);
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(uVar7 + 3));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_06,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  r_code::Atom::Operator((ushort)local_64,(uchar)Opcodes::Mul);
  extent_index = uVar7 + 4;
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)extent_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_07,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  r_code::Atom::VLPointer((ushort)local_64,(ushort)local_48);
  extent_index = uVar7 + 5;
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)extent_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_08,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  extent_index = uVar7 + 6;
  r_code::Atom::IPointer((ushort)local_64);
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(uVar7 + 6));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_09,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  extent_index = uVar7 + 7;
  r_code::Utils::SetTimestamp(mdl,extent_index,(local_40->super_TimingGuardBuilder).period);
  extent_index = uVar7 + 9;
  *write_index = extent_index;
  *write_index = uVar7 + 10;
  r_code::Atom::IPointer((ushort)local_64);
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,4);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_10,iVar5),(Atom *)local_64);
  local_5c = uVar8;
  r_code::Atom::~Atom((Atom *)local_64);
  r_code::Atom::Set((uchar)local_64);
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)*write_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_11,iVar5),(Atom *)local_64);
  pTVar9 = (TimingGuardBuilder *)local_64;
  r_code::Atom::~Atom((Atom *)pTVar9);
  pSVar1 = local_40;
  extent_index = *write_index + 5;
  uVar4 = (uint16_t)local_54;
  TimingGuardBuilder::write_guard
            (pTVar9,mdl,(uint16_t)local_58,uVar4,Opcodes::Sub,
             (local_40->super_TimingGuardBuilder).period,write_index,&extent_index);
  uVar7 = (uint16_t)local_50;
  TimingGuardBuilder::write_guard
            (pTVar9,mdl,(uint16_t)local_34,uVar7,Opcodes::Sub,
             (pSVar1->super_TimingGuardBuilder).period,write_index,&extent_index);
  TimingGuardBuilder::write_guard
            (pTVar9,mdl,local_4a,uVar4,Opcodes::Sub,pSVar1->offset,write_index,&extent_index);
  TimingGuardBuilder::write_guard
            (pTVar9,mdl,local_4c,uVar7,Opcodes::Sub,pSVar1->offset,write_index,&extent_index);
  uVar7 = extent_index;
  uVar3 = extent_index + 1;
  extent_index = uVar3;
  r_code::Atom::AssignmentPointer((uchar)local_64,(ushort)(byte)local_48);
  uVar4 = *write_index;
  *write_index = uVar4 + 1;
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(uVar4 + 1));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_12,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  r_code::Atom::Operator((ushort)local_64,(uchar)Opcodes::Div);
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)uVar3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_13,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  extent_index = uVar7 + 2;
  r_code::Atom::IPointer((ushort)local_64);
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(uVar7 + 2));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_14,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  extent_index = uVar7 + 3;
  r_code::Atom::IPointer((ushort)local_64);
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)(ushort)(uVar7 + 3));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_15,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  r_code::Atom::Operator((ushort)local_64,(uchar)Opcodes::Sub);
  extent_index = uVar7 + 4;
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)extent_index);
  uVar8 = local_5c;
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_16,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  r_code::Atom::VLPointer((ushort)local_64,(ushort)local_44);
  extent_index = uVar7 + 5;
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)extent_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_17,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  r_code::Atom::VLPointer((ushort)local_64,(ushort)uVar8);
  extent_index = uVar7 + 6;
  iVar5 = (*(mdl->super__Object)._vptr__Object[4])(mdl,(ulong)extent_index);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_18,iVar5),(Atom *)local_64);
  r_code::Atom::~Atom((Atom *)local_64);
  extent_index = uVar7 + 7;
  r_code::Utils::SetTimestamp(mdl,extent_index,(local_40->super_TimingGuardBuilder).period);
  *write_index = uVar7 + 9;
  return;
}

Assistant:

void SGuardBuilder::_build(Code *mdl, uint16_t q0, uint16_t t0, uint16_t t1, uint16_t &write_index) const
{
    Code *rhs = mdl->get_reference(1);
    uint16_t t2 = rhs->code(FACT_AFTER).asIndex();
    uint16_t t3 = rhs->code(FACT_BEFORE).asIndex();
    uint16_t q1 = rhs->get_reference(0)->code(MK_VAL_VALUE).asIndex();
    Code *lhs = mdl->get_reference(0);
    uint16_t speed_t0 = lhs->code(FACT_AFTER).asIndex();
    uint16_t speed_t1 = lhs->code(FACT_BEFORE).asIndex();
    uint16_t speed_value = lhs->get_reference(0)->code(MK_VAL_VALUE).asIndex();
    mdl->code(MDL_FWD_GUARDS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(3);
    uint16_t extent_index = write_index + 3;
    write_guard(mdl, t2, t0, Opcodes::Add, period, write_index, extent_index);
    write_guard(mdl, t3, t1, Opcodes::Add, period, write_index, extent_index);
    mdl->code(++write_index) = Atom::AssignmentPointer(q1, ++extent_index);
    mdl->code(extent_index) = Atom::Operator(Opcodes::Add, 2); // q1:(+ q0 (* s period))
    mdl->code(++extent_index) = Atom::VLPointer(q0);
    extent_index++;
    mdl->code(extent_index) = Atom::IPointer(extent_index + 1);
    mdl->code(++extent_index) = Atom::Operator(Opcodes::Mul, 2);
    mdl->code(++extent_index) = Atom::VLPointer(speed_value);
    extent_index++;
    mdl->code(extent_index) = Atom::IPointer(extent_index + 1);
    Utils::SetTimestamp(mdl, ++extent_index, period);
    extent_index += 2;
    write_index = extent_index;
    mdl->code(MDL_BWD_GUARDS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(5);
    extent_index = write_index + 5;
    write_guard(mdl, t0, t2, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, t1, t3, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, speed_t0, t2, Opcodes::Sub, offset, write_index, extent_index);
    write_guard(mdl, speed_t1, t3, Opcodes::Sub, offset, write_index, extent_index);
    mdl->code(++write_index) = Atom::AssignmentPointer(speed_value, ++extent_index);
    mdl->code(extent_index) = Atom::Operator(Opcodes::Div, 2); // s:(/ (- q1 q0) period)
    extent_index++;
    mdl->code(extent_index) = Atom::IPointer(extent_index + 2);
    extent_index++;
    mdl->code(extent_index) = Atom::IPointer(extent_index + 4);
    mdl->code(++extent_index) = Atom::Operator(Opcodes::Sub, 2);
    mdl->code(++extent_index) = Atom::VLPointer(q1);
    mdl->code(++extent_index) = Atom::VLPointer(q0);
    Utils::SetTimestamp(mdl, ++extent_index, period);
    extent_index += 2;
    write_index = extent_index;
}